

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.c
# Opt level: O2

int yaml_document_initialize
              (yaml_document_t *document,yaml_version_directive_t *version_directive,
              yaml_tag_directive_t *tag_directives_start,yaml_tag_directive_t *tag_directives_end,
              int start_implicit,int end_implicit)

{
  int iVar1;
  yaml_node_t *__ptr;
  yaml_version_directive_t *__ptr_00;
  yaml_tag_directive_t *pyVar2;
  size_t sVar3;
  yaml_char_t *pyVar4;
  yaml_char_t *pyVar5;
  yaml_tag_directive_t *pyVar6;
  yaml_tag_directive_t *__ptr_01;
  yaml_tag_directive_t *local_80;
  yaml_tag_directive_t *local_78;
  yaml_tag_directive_t *local_70;
  int local_68;
  int local_64;
  yaml_tag_directive_t *local_60;
  yaml_mark_t mark;
  
  mark.index = 0;
  mark.line = 0;
  mark.column = 0;
  if (document == (yaml_document_t *)0x0) {
    __assert_fail("document",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/w23[P]stameska/3p/libyaml/src/api.c"
                  ,0x423,
                  "int yaml_document_initialize(yaml_document_t *, yaml_version_directive_t *, yaml_tag_directive_t *, yaml_tag_directive_t *, int, int)"
                 );
  }
  local_60 = tag_directives_end;
  if ((tag_directives_start != tag_directives_end) &&
     (tag_directives_start == (yaml_tag_directive_t *)0x0 ||
      tag_directives_end == (yaml_tag_directive_t *)0x0)) {
    __assert_fail("(tag_directives_start && tag_directives_end) || (tag_directives_start == tag_directives_end)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/w23[P]stameska/3p/libyaml/src/api.c"
                  ,0x425,
                  "int yaml_document_initialize(yaml_document_t *, yaml_version_directive_t *, yaml_tag_directive_t *, yaml_tag_directive_t *, int, int)"
                 );
  }
  __ptr = (yaml_node_t *)malloc(0x600);
  if (__ptr == (yaml_node_t *)0x0) {
LAB_001917e0:
    __ptr_00 = (yaml_version_directive_t *)0x0;
LAB_001917e8:
    pyVar4 = (yaml_char_t *)0x0;
    pyVar5 = (yaml_char_t *)0x0;
    pyVar6 = (yaml_tag_directive_t *)0x0;
    __ptr_01 = (yaml_tag_directive_t *)0x0;
LAB_00191925:
    while( true ) {
      free(__ptr);
      free(__ptr_00);
      if (pyVar6 == __ptr_01) break;
      __ptr = (yaml_node_t *)pyVar6[-1].handle;
      __ptr_00 = (yaml_version_directive_t *)pyVar6[-1].prefix;
      pyVar6 = pyVar6 + -1;
    }
    free(__ptr_01);
    free(pyVar4);
    free(pyVar5);
    iVar1 = 0;
  }
  else {
    local_64 = start_implicit;
    if (version_directive == (yaml_version_directive_t *)0x0) {
      __ptr_00 = (yaml_version_directive_t *)0x0;
    }
    else {
      __ptr_00 = (yaml_version_directive_t *)malloc(8);
      if (__ptr_00 == (yaml_version_directive_t *)0x0) goto LAB_001917e0;
      *__ptr_00 = *version_directive;
    }
    if (tag_directives_start == local_60) {
      pyVar2 = (yaml_tag_directive_t *)0x0;
      local_80 = (yaml_tag_directive_t *)0x0;
    }
    else {
      local_68 = end_implicit;
      pyVar2 = (yaml_tag_directive_t *)malloc(0x100);
      local_80 = pyVar2;
      if (pyVar2 == (yaml_tag_directive_t *)0x0) goto LAB_001917e8;
      local_78 = pyVar2 + 0x10;
      for (; end_implicit = local_68, tag_directives_start != local_60;
          tag_directives_start = tag_directives_start + 1) {
        pyVar4 = tag_directives_start->handle;
        local_70 = pyVar2;
        if (pyVar4 == (yaml_char_t *)0x0) {
          __assert_fail("tag_directive->handle",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/w23[P]stameska/3p/libyaml/src/api.c"
                        ,0x437,
                        "int yaml_document_initialize(yaml_document_t *, yaml_version_directive_t *, yaml_tag_directive_t *, yaml_tag_directive_t *, int, int)"
                       );
        }
        pyVar5 = tag_directives_start->prefix;
        if (pyVar5 == (yaml_char_t *)0x0) {
          __assert_fail("tag_directive->prefix",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/w23[P]stameska/3p/libyaml/src/api.c"
                        ,0x438,
                        "int yaml_document_initialize(yaml_document_t *, yaml_version_directive_t *, yaml_tag_directive_t *, yaml_tag_directive_t *, int, int)"
                       );
        }
        sVar3 = strlen((char *)pyVar4);
        iVar1 = yaml_check_utf8(pyVar4,sVar3);
        if (iVar1 == 0) {
LAB_00191907:
          pyVar4 = (yaml_char_t *)0x0;
          pyVar5 = (yaml_char_t *)0x0;
          pyVar6 = local_70;
          __ptr_01 = local_80;
          goto LAB_00191925;
        }
        sVar3 = strlen((char *)pyVar5);
        iVar1 = yaml_check_utf8(pyVar5,sVar3);
        if (iVar1 == 0) goto LAB_00191907;
        pyVar4 = yaml_strdup(pyVar4);
        pyVar5 = yaml_strdup(pyVar5);
        pyVar6 = local_70;
        __ptr_01 = local_80;
        if (((pyVar4 == (yaml_char_t *)0x0) || (pyVar5 == (yaml_char_t *)0x0)) ||
           ((pyVar6 = pyVar2, pyVar2 == local_78 &&
            (iVar1 = yaml_stack_extend(&local_80,&local_70,&local_78), pyVar6 = local_70,
            __ptr_01 = local_80, iVar1 == 0)))) goto LAB_00191925;
        pyVar2 = pyVar6 + 1;
        pyVar6->handle = pyVar4;
        pyVar6->prefix = pyVar5;
      }
    }
    (document->nodes).start = __ptr;
    (document->nodes).end = __ptr + 0x10;
    (document->nodes).top = __ptr;
    document->version_directive = __ptr_00;
    (document->tag_directives).start = local_80;
    (document->tag_directives).end = pyVar2;
    document->start_implicit = local_64;
    document->end_implicit = end_implicit;
    (document->start_mark).index = mark.index;
    (document->start_mark).line = mark.line;
    (document->start_mark).column = mark.column;
    (document->end_mark).index = mark.index;
    (document->end_mark).line = mark.line;
    (document->end_mark).column = mark.column;
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

YAML_DECLARE(int)
yaml_document_initialize(yaml_document_t *document,
        yaml_version_directive_t *version_directive,
        yaml_tag_directive_t *tag_directives_start,
        yaml_tag_directive_t *tag_directives_end,
        int start_implicit, int end_implicit)
{
    struct {
        yaml_error_type_t error;
    } context;
    struct {
        yaml_node_t *start;
        yaml_node_t *end;
        yaml_node_t *top;
    } nodes = { NULL, NULL, NULL };
    yaml_version_directive_t *version_directive_copy = NULL;
    struct {
        yaml_tag_directive_t *start;
        yaml_tag_directive_t *end;
        yaml_tag_directive_t *top;
    } tag_directives_copy = { NULL, NULL, NULL };
    yaml_tag_directive_t value = { NULL, NULL };
    yaml_mark_t mark = { 0, 0, 0 };

    assert(document);       /* Non-NULL document object is expected. */
    assert((tag_directives_start && tag_directives_end) ||
            (tag_directives_start == tag_directives_end));
                            /* Valid tag directives are expected. */

    if (!STACK_INIT(&context, nodes, yaml_node_t*)) goto error;

    if (version_directive) {
        version_directive_copy = YAML_MALLOC_STATIC(yaml_version_directive_t);
        if (!version_directive_copy) goto error;
        version_directive_copy->major = version_directive->major;
        version_directive_copy->minor = version_directive->minor;
    }

    if (tag_directives_start != tag_directives_end) {
        yaml_tag_directive_t *tag_directive;
        if (!STACK_INIT(&context, tag_directives_copy, yaml_tag_directive_t*))
            goto error;
        for (tag_directive = tag_directives_start;
                tag_directive != tag_directives_end; tag_directive ++) {
            assert(tag_directive->handle);
            assert(tag_directive->prefix);
            if (!yaml_check_utf8(tag_directive->handle,
                        strlen((char *)tag_directive->handle)))
                goto error;
            if (!yaml_check_utf8(tag_directive->prefix,
                        strlen((char *)tag_directive->prefix)))
                goto error;
            value.handle = yaml_strdup(tag_directive->handle);
            value.prefix = yaml_strdup(tag_directive->prefix);
            if (!value.handle || !value.prefix) goto error;
            if (!PUSH(&context, tag_directives_copy, value))
                goto error;
            value.handle = NULL;
            value.prefix = NULL;
        }
    }

    DOCUMENT_INIT(*document, nodes.start, nodes.end, version_directive_copy,
            tag_directives_copy.start, tag_directives_copy.top,
            start_implicit, end_implicit, mark, mark);

    return 1;

error:
    STACK_DEL(&context, nodes);
    yaml_free(version_directive_copy);
    while (!STACK_EMPTY(&context, tag_directives_copy)) {
        yaml_tag_directive_t value = POP(&context, tag_directives_copy);
        yaml_free(value.handle);
        yaml_free(value.prefix);
    }
    STACK_DEL(&context, tag_directives_copy);
    yaml_free(value.handle);
    yaml_free(value.prefix);

    return 0;
}